

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O1

void __thiscall
TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_>::ComputeV2
          (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *this,TPZFMatrix<double> *x,
          TPZFMatrix<double> *v2)

{
  int isub;
  _List_node_base *p_Var1;
  TPZFMatrix<double> local_7a0;
  double adStack_710 [101];
  TPZFMatrix<double> local_3e8;
  double local_358 [101];
  
  p_Var1 = (this->fGlobal).
           super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)&this->fGlobal) {
    isub = 0;
    do {
      local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0185f360;
      local_3e8.fSize = 100;
      local_3e8.fElem = local_358;
      local_3e8.fGiven = local_358;
      TPZVec<int>::TPZVec(&local_3e8.fPivot.super_TPZVec<int>,0);
      local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
      local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
      local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_3e8.fWork.fNAlloc = 0;
      local_3e8.fWork.fStore = (double *)0x0;
      local_3e8.fWork.fNElements = 0;
      local_3e8.fElem = (double *)0x0;
      local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_0185f070;
      local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0185f360;
      local_7a0.fSize = 100;
      local_7a0.fElem = adStack_710;
      local_7a0.fGiven = adStack_710;
      TPZVec<int>::TPZVec(&local_7a0.fPivot.super_TPZVec<int>,0);
      local_7a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_7a0.fPivot.super_TPZVec<int>.fStore = local_7a0.fPivot.fExtAlloc;
      local_7a0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_7a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_7a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_7a0.fWork.fNAlloc = 0;
      local_7a0.fWork.fStore = (double *)0x0;
      local_7a0.fWork.fNElements = 0;
      local_7a0.fElem = (double *)0x0;
      local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_0185f070;
      TPZDohrAssembly<double>::Extract(((this->fAssemble).fRef)->fPointer,isub,x,&local_3e8);
      TPZDohrSubstructCondense<double>::Contribute_v2_local
                ((TPZDohrSubstructCondense<double> *)(p_Var1[1]._M_next)->_M_next,&local_3e8,
                 &local_7a0);
      TPZDohrAssembly<double>::Assemble(((this->fAssemble).fRef)->fPointer,isub,&local_7a0,v2);
      TPZFMatrix<double>::~TPZFMatrix(&local_7a0,&PTR_PTR_0185f328);
      TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_0185f328);
      isub = isub + 1;
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)&this->fGlobal);
  }
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV2(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v2) const
{
	
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// contribute v2 deve ser uma tarefa inicializada mais cedo
		TPZFNMatrix<100,TVar> Residual_local,v2_local;
		fAssemble->Extract(isub,x,Residual_local);
		(*it)->Contribute_v2_local(Residual_local,v2_local);
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Substructure " << isub << std::endl;
			Residual_local.Print("Residual local",sout);
            v2_local.Print("v2_local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		//		v2_local += v1_local;
		fAssemble->Assemble(isub,v2_local,v2);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v2.Print("v2 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}